

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int renameResolveTrigger(Parse *pParse,char *zDb)

{
  Trigger *pTVar1;
  Db *pDVar2;
  Schema *pSVar3;
  anon_union_8_3_1bb8468b_for_uNC aVar4;
  int iVar5;
  int iVar6;
  Table *pTVar7;
  long lVar8;
  Schema **ppSVar9;
  TriggerStep *pTVar10;
  SrcList sSrc;
  NameContext local_e0;
  SrcList local_a8;
  
  pTVar1 = pParse->pNewTrigger;
  local_e0._40_8_ = 0;
  local_e0.pWinSelect = (Select *)0x0;
  local_e0.pNext = (NameContext *)0x0;
  local_e0.nRef = 0;
  local_e0.nErr = 0;
  local_e0.pSrcList = (SrcList *)0x0;
  local_e0.uNC.pEList = (ExprList *)0x0;
  pDVar2 = pParse->db->aDb;
  if (pTVar1->pTabSchema == (Schema *)0x0) {
    lVar8 = -1000000;
  }
  else {
    lVar8 = -0x100000000;
    ppSVar9 = &pDVar2->pSchema;
    do {
      lVar8 = lVar8 + 0x100000000;
      pSVar3 = *ppSVar9;
      ppSVar9 = ppSVar9 + 4;
    } while (pSVar3 != pTVar1->pTabSchema);
    lVar8 = lVar8 >> 0x20;
  }
  local_e0.pParse = pParse;
  pTVar7 = sqlite3FindTable(pParse->db,pTVar1->table,pDVar2[lVar8].zDbSName);
  pParse->pTriggerTab = pTVar7;
  pParse->eTriggerOp = pTVar1->op;
  if ((pTVar7 != (Table *)0x0) && (iVar5 = sqlite3ViewGetColumnNames(pParse,pTVar7), iVar5 != 0)) {
    return 1;
  }
  if (pTVar1->pWhen == (Expr *)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = sqlite3ResolveExprNames(&local_e0,pTVar1->pWhen);
  }
  pTVar10 = pTVar1->step_list;
  if (pTVar10 == (TriggerStep *)0x0 || iVar5 != 0) {
    return iVar5;
  }
  do {
    if (((pTVar10->pSelect != (Select *)0x0) &&
        (sqlite3SelectPrep(pParse,pTVar10->pSelect,&local_e0), pParse->nErr != 0)) &&
       (pParse->rc != 0)) {
      return pParse->rc;
    }
    if (pTVar10->zTarget == (char *)0x0) {
      iVar5 = 0;
    }
    else {
      pTVar7 = sqlite3LocateTable(pParse,0,pTVar10->zTarget,zDb);
      if (pTVar7 == (Table *)0x0) {
        return 1;
      }
      iVar5 = sqlite3ViewGetColumnNames(pParse,pTVar7);
      if (iVar5 != 0) {
        return 1;
      }
      local_a8.a[0].pSchema = (Schema *)0x0;
      local_a8.a[0].colUsed = 0;
      local_a8.a[0].u1.zIndexedBy = (char *)0x0;
      local_a8.a[0].pOn = (Expr *)0x0;
      local_a8.a[0].pUsing = (IdList *)0x0;
      local_a8.a[0].regResult = 0;
      local_a8.a[0].fg = (anon_struct_4_7_7ffbf296_for_fg)0x0;
      local_a8.a[0].iCursor = 0;
      local_a8.a[0]._68_4_ = 0;
      local_a8.a[0].pSelect = (Select *)0x0;
      local_a8.a[0].addrFillSub = 0;
      local_a8.a[0].regReturn = 0;
      local_a8.a[0].zAlias = (char *)0x0;
      local_a8.a[0].zDatabase = (char *)0x0;
      local_a8.a[0].pIBIndex = (Index *)0x0;
      local_a8.nSrc = 1;
      local_a8.nAlloc = 0;
      local_a8.a[0].zName = pTVar10->zTarget;
      local_e0.pSrcList = &local_a8;
      local_a8.a[0].pTab = pTVar7;
      if (pTVar10->pWhere == (Expr *)0x0) {
LAB_001bfb10:
        iVar5 = sqlite3ResolveExprListNames(&local_e0,pTVar10->pExprList);
      }
      else {
        iVar6 = sqlite3ResolveExprNames(&local_e0,pTVar10->pWhere);
        iVar5 = 1;
        if (iVar6 == 0) goto LAB_001bfb10;
      }
      aVar4 = (anon_union_8_3_1bb8468b_for_uNC)pTVar10->pUpsert;
      if ((Upsert *)aVar4.pEList != (Upsert *)0x0) {
        (aVar4.pUpsert)->pUpsertSrc = &local_a8;
        local_e0.ncFlags = 0x200;
        local_e0.uNC = aVar4;
        iVar5 = sqlite3ResolveExprListNames(&local_e0,(aVar4.pUpsert)->pUpsertTarget);
        if ((iVar5 == 0) &&
           (iVar5 = sqlite3ResolveExprListNames(&local_e0,(aVar4.pUpsert)->pUpsertSet), iVar5 == 0))
        {
          iVar6 = sqlite3ResolveExprNames(&local_e0,(Expr *)(aVar4.pEList)->a[0].zSpan);
          iVar5 = 1;
          if (iVar6 == 0) {
            iVar5 = sqlite3ResolveExprNames(&local_e0,(aVar4.pEList)->a[0].pExpr);
          }
        }
        local_e0._40_8_ = local_e0._40_8_ & 0xffffffff00000000;
      }
      local_e0.pSrcList = (SrcList *)0x0;
    }
    if (iVar5 != 0) {
      return iVar5;
    }
    pTVar10 = pTVar10->pNext;
    if (pTVar10 == (TriggerStep *)0x0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int renameResolveTrigger(Parse *pParse, const char *zDb){
  sqlite3 *db = pParse->db;
  Trigger *pNew = pParse->pNewTrigger;
  TriggerStep *pStep;
  NameContext sNC;
  int rc = SQLITE_OK;

  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  assert( pNew->pTabSchema );
  pParse->pTriggerTab = sqlite3FindTable(db, pNew->table, 
      db->aDb[sqlite3SchemaToIndex(db, pNew->pTabSchema)].zDbSName
  );
  pParse->eTriggerOp = pNew->op;
  /* ALWAYS() because if the table of the trigger does not exist, the
  ** error would have been hit before this point */
  if( ALWAYS(pParse->pTriggerTab) ){
    rc = sqlite3ViewGetColumnNames(pParse, pParse->pTriggerTab);
  }

  /* Resolve symbols in WHEN clause */
  if( rc==SQLITE_OK && pNew->pWhen ){
    rc = sqlite3ResolveExprNames(&sNC, pNew->pWhen);
  }

  for(pStep=pNew->step_list; rc==SQLITE_OK && pStep; pStep=pStep->pNext){
    if( pStep->pSelect ){
      sqlite3SelectPrep(pParse, pStep->pSelect, &sNC);
      if( pParse->nErr ) rc = pParse->rc;
    }
    if( rc==SQLITE_OK && pStep->zTarget ){
      Table *pTarget = sqlite3LocateTable(pParse, 0, pStep->zTarget, zDb);
      if( pTarget==0 ){
        rc = SQLITE_ERROR;
      }else if( SQLITE_OK==(rc = sqlite3ViewGetColumnNames(pParse, pTarget)) ){
        SrcList sSrc;
        memset(&sSrc, 0, sizeof(sSrc));
        sSrc.nSrc = 1;
        sSrc.a[0].zName = pStep->zTarget;
        sSrc.a[0].pTab = pTarget;
        sNC.pSrcList = &sSrc;
        if( pStep->pWhere ){
          rc = sqlite3ResolveExprNames(&sNC, pStep->pWhere);
        }
        if( rc==SQLITE_OK ){
          rc = sqlite3ResolveExprListNames(&sNC, pStep->pExprList);
        }
        assert( !pStep->pUpsert || (!pStep->pWhere && !pStep->pExprList) );
        if( pStep->pUpsert ){
          Upsert *pUpsert = pStep->pUpsert;
          assert( rc==SQLITE_OK );
          pUpsert->pUpsertSrc = &sSrc;
          sNC.uNC.pUpsert = pUpsert;
          sNC.ncFlags = NC_UUpsert;
          rc = sqlite3ResolveExprListNames(&sNC, pUpsert->pUpsertTarget);
          if( rc==SQLITE_OK ){
            ExprList *pUpsertSet = pUpsert->pUpsertSet;
            rc = sqlite3ResolveExprListNames(&sNC, pUpsertSet);
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3ResolveExprNames(&sNC, pUpsert->pUpsertWhere);
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3ResolveExprNames(&sNC, pUpsert->pUpsertTargetWhere);
          }
          sNC.ncFlags = 0;
        }
        sNC.pSrcList = 0;
      }
    }
  }
  return rc;
}